

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O1

int eckey_sign_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                   size_t *sig_len,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  mbedtls_ecdsa_context ecdsa;
  
  mbedtls_ecdsa_init(&ecdsa);
  iVar1 = mbedtls_ecdsa_from_keypair(&ecdsa,(mbedtls_ecp_keypair *)ctx);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecdsa_write_signature(&ecdsa,md_alg,hash,hash_len,sig,sig_len,f_rng,p_rng);
  }
  mbedtls_ecdsa_free(&ecdsa);
  return iVar1;
}

Assistant:

static int eckey_sign_wrap( void *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   unsigned char *sig, size_t *sig_len,
                   int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;
    mbedtls_ecdsa_context ecdsa;

    mbedtls_ecdsa_init( &ecdsa );

    if( ( ret = mbedtls_ecdsa_from_keypair( &ecdsa, ctx ) ) == 0 )
        ret = ecdsa_sign_wrap( &ecdsa, md_alg, hash, hash_len, sig, sig_len,
                               f_rng, p_rng );

    mbedtls_ecdsa_free( &ecdsa );

    return( ret );
}